

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirABYTEC(void)

{
  int iVar1;
  int local_c [2];
  aint add;
  
  iVar1 = ParseExpressionNoSyntaxError(&lp,local_c);
  if (iVar1 == 0) {
    Error("ABYTEC <offset> <bytes>: parsing <offset> failed",bp,SUPPRESS);
  }
  else {
    Relocation::checkAndWarn(false);
    getBytesWithCheck(local_c[0],1,false);
  }
  return;
}

Assistant:

static void dirABYTEC() {
	aint add;
	if (ParseExpressionNoSyntaxError(lp, add)) {
		Relocation::checkAndWarn();
		getBytesWithCheck(add, 1);
	} else {
		Error("ABYTEC <offset> <bytes>: parsing <offset> failed", bp, SUPPRESS);
	}
}